

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_reader_init_mem(mz_zip_archive *pZip,void *pMem,size_t size,mz_uint32 flags)

{
  mz_bool mVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  mz_uint32 in_stack_00001044;
  mz_zip_archive *in_stack_00001048;
  undefined4 in_stack_ffffffffffffffd8;
  mz_bool local_4;
  
  mVar1 = tinyexr::miniz::mz_zip_reader_init_internal
                    ((mz_zip_archive *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),0);
  if (mVar1 == 0) {
    local_4 = 0;
  }
  else {
    *in_RDI = in_RDX;
    in_RDI[8] = tinyexr::miniz::mz_zip_mem_read_func;
    in_RDI[10] = in_RDI;
    *(undefined8 *)(in_RDI[0xb] + 0x68) = in_RSI;
    *(undefined8 *)(in_RDI[0xb] + 0x70) = in_RDX;
    mVar1 = tinyexr::miniz::mz_zip_reader_read_central_dir(in_stack_00001048,in_stack_00001044);
    if (mVar1 == 0) {
      mz_zip_reader_end((mz_zip_archive *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

mz_bool mz_zip_reader_init_mem(mz_zip_archive *pZip, const void *pMem,
                               size_t size, mz_uint32 flags) {
  if (!mz_zip_reader_init_internal(pZip, flags)) return MZ_FALSE;
  pZip->m_archive_size = size;
  pZip->m_pRead = mz_zip_mem_read_func;
  pZip->m_pIO_opaque = pZip;
#ifdef __cplusplus
  pZip->m_pState->m_pMem = const_cast<void *>(pMem);
#else
  pZip->m_pState->m_pMem = (void *)pMem;
#endif
  pZip->m_pState->m_mem_size = size;
  if (!mz_zip_reader_read_central_dir(pZip, flags)) {
    mz_zip_reader_end(pZip);
    return MZ_FALSE;
  }
  return MZ_TRUE;
}